

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fBufferCopyTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles3::Functional::BasicBufferCopyCase::iterate(BasicBufferCopyCase *this)

{
  CallLogWrapper *this_00;
  deUint32 dVar1;
  deUint32 dVar2;
  GLenum GVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  char *description;
  byte bVar8;
  BufferVerifier verifier;
  ReferenceBuffer dstRef;
  ReferenceBuffer srcRef;
  
  deqp::gls::BufferTestUtil::BufferVerifier::BufferVerifier
            (&verifier,(this->super_BufferCase).m_renderCtx,
             ((this->super_BufferCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
             this->m_verifyType);
  srcRef.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  srcRef.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  srcRef.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dstRef.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  dstRef.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  dstRef.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dVar1 = deStringHash((this->super_BufferCase).super_TestCase.super_TestNode.m_name._M_dataplus.
                       _M_p);
  dVar2 = deStringHash((this->super_BufferCase).super_TestCase.super_TestNode.m_name._M_dataplus.
                       _M_p);
  deqp::gls::BufferTestUtil::ReferenceBuffer::setSize(&srcRef,this->m_srcSize);
  deqp::gls::BufferTestUtil::fillWithRandomBytes
            (srcRef.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
             .super__Vector_impl_data._M_start,this->m_srcSize,dVar1 ^ 0xabcd);
  deqp::gls::BufferTestUtil::ReferenceBuffer::setSize(&dstRef,this->m_dstSize);
  deqp::gls::BufferTestUtil::fillWithRandomBytes
            (dstRef.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
             .super__Vector_impl_data._M_start,this->m_dstSize,dVar2 ^ 0xef01);
  dVar1 = deqp::gls::BufferTestUtil::BufferCase::genBuffer(&this->super_BufferCase);
  this_00 = &(this->super_BufferCase).super_CallLogWrapper;
  glu::CallLogWrapper::glBindBuffer(this_00,this->m_srcTarget,dVar1);
  glu::CallLogWrapper::glBufferData
            (this_00,this->m_srcTarget,(long)this->m_srcSize,
             srcRef.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
             .super__Vector_impl_data._M_start,this->m_srcHint);
  GVar3 = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(GVar3,"glBufferData",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBufferCopyTests.cpp"
                  ,100);
  dVar2 = deqp::gls::BufferTestUtil::BufferCase::genBuffer(&this->super_BufferCase);
  glu::CallLogWrapper::glBindBuffer(this_00,this->m_dstTarget,dVar2);
  glu::CallLogWrapper::glBufferData
            (this_00,this->m_dstTarget,(long)this->m_dstSize,
             dstRef.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
             .super__Vector_impl_data._M_start,this->m_dstHint);
  GVar3 = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(GVar3,"glBufferData",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBufferCopyTests.cpp"
                  ,0x6a);
  iVar4 = deqp::gls::BufferTestUtil::BufferVerifier::verify
                    (&verifier,(EVP_PKEY_CTX *)(ulong)dVar1,
                     srcRef.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                     ._M_impl.super__Vector_impl_data._M_start,0,
                     (uchar *)(ulong)(uint)this->m_srcSize,(ulong)this->m_srcTarget);
  iVar5 = deqp::gls::BufferTestUtil::BufferVerifier::verify
                    (&verifier,(EVP_PKEY_CTX *)(ulong)dVar2,
                     dstRef.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                     ._M_impl.super__Vector_impl_data._M_start,0,
                     (uchar *)(ulong)(uint)this->m_dstSize,(ulong)this->m_dstTarget);
  memcpy(dstRef.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start + this->m_copyDstOffset,
         srcRef.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start + this->m_copySrcOffset,(long)this->m_copySize);
  glu::CallLogWrapper::glBindBuffer(this_00,this->m_srcTarget,dVar1);
  glu::CallLogWrapper::glBindBuffer(this_00,this->m_dstTarget,dVar2);
  glu::CallLogWrapper::glCopyBufferSubData
            (this_00,this->m_srcTarget,this->m_dstTarget,(long)this->m_copySrcOffset,
             (long)this->m_copyDstOffset,(long)this->m_copySize);
  GVar3 = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(GVar3,"glCopyBufferSubData",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBufferCopyTests.cpp"
                  ,0x76);
  iVar6 = deqp::gls::BufferTestUtil::BufferVerifier::verify
                    (&verifier,(EVP_PKEY_CTX *)(ulong)dVar1,
                     srcRef.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                     ._M_impl.super__Vector_impl_data._M_start,0,
                     (uchar *)(ulong)(uint)this->m_srcSize,(ulong)this->m_srcTarget);
  iVar7 = deqp::gls::BufferTestUtil::BufferVerifier::verify
                    (&verifier,(EVP_PKEY_CTX *)(ulong)dVar2,
                     dstRef.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                     ._M_impl.super__Vector_impl_data._M_start,0,
                     (uchar *)(ulong)(uint)this->m_dstSize,(ulong)this->m_dstTarget);
  bVar8 = (byte)iVar4 & (byte)iVar5 & (byte)iVar6 & (byte)iVar7;
  description = "Buffer verification failed";
  if (bVar8 != 0) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_BufferCase).super_TestCase.super_TestNode.m_testCtx,(uint)(bVar8 ^ 1),
             description);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&dstRef);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&srcRef);
  deqp::gls::BufferTestUtil::BufferVerifier::~BufferVerifier(&verifier);
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		BufferVerifier	verifier	(m_renderCtx, m_testCtx.getLog(), m_verifyType);
		ReferenceBuffer	srcRef;
		ReferenceBuffer	dstRef;
		deUint32		srcBuf		= 0;
		deUint32		dstBuf		= 0;
		deUint32		srcSeed		= deStringHash(getName()) ^ 0xabcd;
		deUint32		dstSeed		= deStringHash(getName()) ^ 0xef01;
		bool			isOk		= true;

		srcRef.setSize(m_srcSize);
		fillWithRandomBytes(srcRef.getPtr(), m_srcSize, srcSeed);

		dstRef.setSize(m_dstSize);
		fillWithRandomBytes(dstRef.getPtr(), m_dstSize, dstSeed);

		// Create source buffer and fill with data.
		srcBuf = genBuffer();
		glBindBuffer(m_srcTarget, srcBuf);
		glBufferData(m_srcTarget, m_srcSize, srcRef.getPtr(), m_srcHint);
		GLU_CHECK_MSG("glBufferData");

		// Create destination buffer and fill with data.
		dstBuf = genBuffer();
		glBindBuffer(m_dstTarget, dstBuf);
		glBufferData(m_dstTarget, m_dstSize, dstRef.getPtr(), m_dstHint);
		GLU_CHECK_MSG("glBufferData");

		// Verify both buffers before executing copy.
		isOk = verifier.verify(srcBuf, srcRef.getPtr(), 0, m_srcSize, m_srcTarget) && isOk;
		isOk = verifier.verify(dstBuf, dstRef.getPtr(), 0, m_dstSize, m_dstTarget) && isOk;

		// Execute copy.
		deMemcpy(dstRef.getPtr()+m_copyDstOffset, srcRef.getPtr()+m_copySrcOffset, m_copySize);

		glBindBuffer(m_srcTarget, srcBuf);
		glBindBuffer(m_dstTarget, dstBuf);
		glCopyBufferSubData(m_srcTarget, m_dstTarget, m_copySrcOffset, m_copyDstOffset, m_copySize);
		GLU_CHECK_MSG("glCopyBufferSubData");

		// Verify both buffers after copy.
		isOk = verifier.verify(srcBuf, srcRef.getPtr(), 0, m_srcSize, m_srcTarget) && isOk;
		isOk = verifier.verify(dstBuf, dstRef.getPtr(), 0, m_dstSize, m_dstTarget) && isOk;

		m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
								isOk ? "Pass"				: "Buffer verification failed");
		return STOP;
	}